

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_unittests.cc
# Opt level: O3

void (anonymous_namespace)::test_color<color<unsigned_char,1u>>
               (color<unsigned_char,_1U> input,color<unsigned_char,_1U> output)

{
  char *pcVar1;
  color<unsigned_char,_1U> color;
  AssertionResult gtest_ar;
  anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3 local_31;
  anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3 local_30;
  undefined7 uStack_2f;
  AssertHelper local_28;
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_31 = input.field_0;
  local_30 = input.field_0;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            (local_20,"color[i]","static_cast<typename ColorType::value_type>(input[i])",
             local_31.comps,local_30.comps);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30.field_1);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/image_unittests.cc"
               ,0x2c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30.field_1);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT71(uStack_2f,local_30) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_2f,local_30) + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  if (local_31 != (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)0x0) {
    local_31 = (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)0xff;
  }
  local_30 = output.field_0;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            (local_20,"color[i]","static_cast<typename ColorType::value_type>(output[i])",
             local_31.comps,local_30.comps);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30.field_1);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/image_unittests.cc"
               ,0x32,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30.field_1);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT71(uStack_2f,local_30) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_2f,local_30) + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  return;
}

Assistant:

void test_color(ColorType input, ColorType output) {
    ColorType color;
    for (uint32_t i = 0; i < color.comps_count(); ++i) {
        color.set(i, static_cast<typename ColorType::value_type>(input[i]));
    }

    // Verify color components were set correctly
    for (uint32_t i = 0; i < color.comps_count(); ++i) {
        EXPECT_EQ(color[i], static_cast<typename ColorType::value_type>(input[i]));
    }

    color.normalize();

    for (uint32_t  i = 0; i < color.comps_count(); ++i) {
        EXPECT_EQ(color[i], static_cast<typename ColorType::value_type>(output[i]));
    }
}